

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult MiniScript::intrinsic_val(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  ListStorage<MiniScript::TACLine> *pLVar2;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar3;
  undefined4 *puVar4;
  Value val;
  undefined1 local_78 [16];
  Value local_68;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_58;
  bool local_50;
  String local_48;
  Value local_38 [2];
  
  local_50 = false;
  pDVar3 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x30);
  (pDVar3->super_RefCountedStorage).refCount = 1;
  (pDVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001d10b0;
  pDVar3->mTable[0] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x5;
  pDVar3->mTable[1] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
  puVar4 = (undefined4 *)operator_new__(5);
  pDVar3->mSize = (long)puVar4;
  *(undefined1 *)(puVar4 + 1) = 0;
  *puVar4 = 0x666c6573;
  local_58 = pDVar3;
  Context::GetVar((Context *)local_78,(String *)partialResult.rs,(LocalOnlyMode)&local_58);
  if ((local_58 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
     (local_50 == false)) {
    plVar1 = &(local_58->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_58->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_58 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
  }
  if (local_78[0] == String) {
    if ((StringStorage *)local_78._8_8_ == (StringStorage *)0x0) {
      local_48.ss = (StringStorage *)0x0;
    }
    else {
      plVar1 = &((RefCountedStorage *)local_78._8_8_)->refCount;
      *plVar1 = *plVar1 + 1;
      local_48.ss = (StringStorage *)local_78._8_8_;
    }
    local_48.isTemp = false;
    local_38[0].data.number = String::DoubleValue(&local_48,"%lf");
    local_38[0].type = Number;
    local_38[0].noInvoke = false;
    local_38[0].localOnly = Off;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     local_38);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((2 < local_38[0].type) &&
       ((ListStorage<MiniScript::Value> *)local_38[0].data.ref !=
        (ListStorage<MiniScript::Value> *)0x0)) {
      plVar1 = &(local_38[0].data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_38[0].data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
      local_38[0].data.number = 0.0;
    }
    if ((local_48.ss != (StringStorage *)0x0) && (local_48.isTemp == false)) {
      plVar1 = &((local_48.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_48.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_48.ss = (StringStorage *)0x0;
    }
  }
  else if (local_78[0] == Number) {
    local_68.type = local_78[0];
    local_68.noInvoke = (bool)local_78[1];
    local_68.localOnly = local_78[2];
    local_68.data.ref = (RefCountedStorage *)local_78._8_8_;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     &local_68);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_68.type) && (local_68.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_68.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_68.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_68.data.number = 0.0;
    }
  }
  else {
    IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
    pLVar2 = IntrinsicResult::Null;
    (context->code).ls = IntrinsicResult::Null;
    if (pLVar2 != (ListStorage<MiniScript::TACLine> *)0x0) {
      plVar1 = &(pLVar2->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + 1;
    }
  }
  if ((Temp < local_78[0]) && ((StringStorage *)local_78._8_8_ != (StringStorage *)0x0)) {
    plVar1 = &((RefCountedStorage *)local_78._8_8_)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((RefCountedStorage *)local_78._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_val(Context *context, IntrinsicResult partialResult) {
		Value val = context->GetVar("self");
		if (val.type == ValueType::Number) return IntrinsicResult(val);
		if (val.type == ValueType::String) return IntrinsicResult(val.GetString().DoubleValue());
		return IntrinsicResult::Null;
	}